

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfragmentmap_p.h
# Opt level: O0

void __thiscall
QFragmentMapData<QTextBlockData>::rotateLeft(QFragmentMapData<QTextBlockData> *this,uint x)

{
  uint index;
  uint index_00;
  quint32 qVar1;
  quint32 qVar2;
  QTextBlockData *pQVar3;
  uint in_ESI;
  anon_union_8_2_e778645c_for_QFragmentMapData<QTextBlockData>_1 *in_RDI;
  uint field;
  uint y;
  uint p;
  uint local_18;
  
  pQVar3 = F((QFragmentMapData<QTextBlockData> *)in_RDI,in_ESI);
  index = (pQVar3->super_QFragment<3>).parent;
  pQVar3 = F((QFragmentMapData<QTextBlockData> *)in_RDI,in_ESI);
  index_00 = (pQVar3->super_QFragment<3>).right;
  if (index_00 == 0) {
    pQVar3 = F((QFragmentMapData<QTextBlockData> *)in_RDI,in_ESI);
    (pQVar3->super_QFragment<3>).right = 0;
  }
  else {
    pQVar3 = F((QFragmentMapData<QTextBlockData> *)in_RDI,index_00);
    qVar1 = (pQVar3->super_QFragment<3>).left;
    pQVar3 = F((QFragmentMapData<QTextBlockData> *)in_RDI,in_ESI);
    (pQVar3->super_QFragment<3>).right = qVar1;
    pQVar3 = F((QFragmentMapData<QTextBlockData> *)in_RDI,index_00);
    if ((pQVar3->super_QFragment<3>).left != 0) {
      pQVar3 = F((QFragmentMapData<QTextBlockData> *)in_RDI,index_00);
      pQVar3 = F((QFragmentMapData<QTextBlockData> *)in_RDI,(pQVar3->super_QFragment<3>).left);
      (pQVar3->super_QFragment<3>).parent = in_ESI;
    }
    pQVar3 = F((QFragmentMapData<QTextBlockData> *)in_RDI,index_00);
    (pQVar3->super_QFragment<3>).left = in_ESI;
    pQVar3 = F((QFragmentMapData<QTextBlockData> *)in_RDI,index_00);
    (pQVar3->super_QFragment<3>).parent = index;
  }
  if (index == 0) {
    in_RDI->head->root = index_00;
  }
  else {
    pQVar3 = F((QFragmentMapData<QTextBlockData> *)in_RDI,index);
    if (in_ESI == (pQVar3->super_QFragment<3>).left) {
      pQVar3 = F((QFragmentMapData<QTextBlockData> *)in_RDI,index);
      (pQVar3->super_QFragment<3>).left = index_00;
    }
    else {
      pQVar3 = F((QFragmentMapData<QTextBlockData> *)in_RDI,index);
      (pQVar3->super_QFragment<3>).right = index_00;
    }
  }
  pQVar3 = F((QFragmentMapData<QTextBlockData> *)in_RDI,in_ESI);
  (pQVar3->super_QFragment<3>).parent = index_00;
  for (local_18 = 0; local_18 < 3; local_18 = local_18 + 1) {
    pQVar3 = F((QFragmentMapData<QTextBlockData> *)in_RDI,in_ESI);
    qVar1 = (pQVar3->super_QFragment<3>).size_left_array[local_18];
    pQVar3 = F((QFragmentMapData<QTextBlockData> *)in_RDI,in_ESI);
    qVar2 = (pQVar3->super_QFragment<3>).size_array[local_18];
    pQVar3 = F((QFragmentMapData<QTextBlockData> *)in_RDI,index_00);
    (pQVar3->super_QFragment<3>).size_left_array[local_18] =
         qVar1 + qVar2 + (pQVar3->super_QFragment<3>).size_left_array[local_18];
  }
  return;
}

Assistant:

void QFragmentMapData<Fragment>::rotateLeft(uint x)
{
    uint p = F(x).parent;
    uint y = F(x).right;


    if (y) {
        F(x).right = F(y).left;
        if (F(y).left)
            F(F(y).left).parent = x;
        F(y).left = x;
        F(y).parent = p;
    } else {
        F(x).right = 0;
    }
    if (!p) {
        Q_ASSERT(head->root == x);
        head->root = y;
    }
    else if (x == F(p).left)
        F(p).left = y;
    else
        F(p).right = y;
    F(x).parent = y;
    for (uint field = 0; field < Fragment::size_array_max; ++field)
        F(y).size_left_array[field] += F(x).size_left_array[field] + F(x).size_array[field];
}